

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::dht_pkt_alert::dht_pkt_alert
          (dht_pkt_alert *this,stack_allocator *alloc,span<const_char> buf,direction_t d,
          endpoint *ep)

{
  stack_allocator *this_00;
  allocation_slot aVar1;
  int iVar2;
  index_type v;
  span<const_char> local_58 [2];
  basic_endpoint<boost::asio::ip::udp> *local_38;
  endpoint *ep_local;
  stack_allocator *psStack_28;
  direction_t d_local;
  stack_allocator *alloc_local;
  dht_pkt_alert *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (dht_pkt_alert *)buf.m_ptr;
  local_38 = ep;
  ep_local._4_4_ = d;
  psStack_28 = alloc;
  alloc_local = (stack_allocator *)this;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_pkt_alert_00991f08;
  this->direction = ep_local._4_4_;
  libtorrent::aux::noexcept_movable<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>::
  noexcept_movable(&this->node,local_38);
  std::reference_wrapper<libtorrent::aux::stack_allocator>::
  reference_wrapper<libtorrent::aux::stack_allocator&,void,libtorrent::aux::stack_allocator*>
            (&this->m_alloc,psStack_28);
  this_00 = psStack_28;
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)local_58,(span<const_char> *)&this_local);
  aVar1 = libtorrent::aux::stack_allocator::copy_buffer(this_00,local_58[0]);
  (this->m_msg_idx).m_idx = aVar1.m_idx;
  v = span<const_char>::size((span<const_char> *)&this_local);
  iVar2 = libtorrent::aux::numeric_cast<int,long,void>(v);
  this->m_size = iVar2;
  this->dir = ep_local._4_4_;
  return;
}

Assistant:

dht_pkt_alert::dht_pkt_alert(aux::stack_allocator& alloc
		, span<char const> buf, dht_pkt_alert::direction_t d
		, udp::endpoint const& ep)
		: direction(d)
		, node(ep)
		, m_alloc(alloc)
		, m_msg_idx(alloc.copy_buffer(buf))
		, m_size(aux::numeric_cast<int>(buf.size()))
#if TORRENT_ABI_VERSION == 1
		, dir(d)
#endif
	{}